

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O1

bool EV_SlidingDoor(line_t_conflict *line,AActor *actor,int tag,int speed,int delay)

{
  line_t_conflict *line_00;
  sector_t_conflict *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FDoorAnimation *pFVar5;
  DAnimatedDoor *pDVar6;
  undefined4 extraout_var;
  DSectorEffect *pDVar7;
  PClass *pPVar8;
  long lVar9;
  byte bVar10;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (tag != 0) {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    bVar10 = 0;
    local_38.searchtag = tag;
    do {
      do {
        do {
          uVar3 = FSectorTagIterator::Next(&local_38);
          if ((int)uVar3 < 0) goto LAB_003e9a5d;
          psVar1 = sectors + uVar3;
          pDVar7 = sectors[uVar3].ceilingdata.field_0.p;
          if (pDVar7 == (DSectorEffect *)0x0) goto LAB_003e98c4;
        } while (((pDVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0);
        (psVar1->ceilingdata).field_0.p = (DSectorEffect *)0x0;
LAB_003e98c4:
      } while (psVar1->linecount < 1);
      lVar9 = 0;
      do {
        line_00 = psVar1->lines[lVar9];
        if ((line_00->backsector != (sector_t_conflict *)0x0) &&
           (pFVar5 = FTextureManager::FindAnimatedDoor
                               (&TexMan,(FTextureID)line_00->sidedef[0]->textures[0].texture.texnum)
           , pFVar5 != (FDoorAnimation *)0x0)) {
          pDVar6 = (DAnimatedDoor *)
                   M_Malloc_Dbg(0x88,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                ,0x1f9);
          bVar10 = 1;
          DAnimatedDoor::DAnimatedDoor(pDVar6,(sector_t *)psVar1,line_00,speed,delay,pFVar5);
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < psVar1->linecount);
    } while( true );
  }
  psVar1 = line->backsector;
  pDVar7 = (psVar1->ceilingdata).field_0.p;
  if (pDVar7 != (DSectorEffect *)0x0) {
    if (((pDVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (actor->player != (player_t *)0x0) {
        pDVar7 = (psVar1->ceilingdata).field_0.p;
        if ((pDVar7 != (DSectorEffect *)0x0) &&
           (((pDVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (psVar1->ceilingdata).field_0.p = (DSectorEffect *)0x0;
          pDVar7 = (DSectorEffect *)0x0;
        }
        pPVar8 = DAnimatedDoor::RegistrationInfo.MyClass;
        if ((pDVar7->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pDVar7->super_DThinker).super_DObject._vptr_DObject)(pDVar7);
          (pDVar7->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        if ((pDVar7->super_DThinker).super_DObject.Class == pPVar8) {
          pDVar6 = (DAnimatedDoor *)(psVar1->ceilingdata).field_0.p;
          if ((pDVar6 != (DAnimatedDoor *)0x0) &&
             (((pDVar6->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.
               super_DObject.ObjectFlags & 0x20) != 0)) {
            (psVar1->ceilingdata).field_0.p = (DSectorEffect *)0x0;
            pDVar6 = (DAnimatedDoor *)0x0;
          }
          iVar4 = pDVar6->m_Status;
          if (iVar4 == 1) {
            bVar2 = DAnimatedDoor::StartClosing(pDVar6);
            pPVar8 = (PClass *)(ulong)bVar2;
          }
          bVar10 = (byte)pPVar8;
          if (iVar4 == 1) goto LAB_003e9a5d;
        }
      }
      bVar10 = 0;
      goto LAB_003e9a5d;
    }
    (psVar1->ceilingdata).field_0.p = (DSectorEffect *)0x0;
  }
  pFVar5 = FTextureManager::FindAnimatedDoor
                     (&TexMan,(FTextureID)line->sidedef[0]->textures[0].texture.texnum);
  bVar10 = pFVar5 != (FDoorAnimation *)0x0;
  if ((bool)bVar10) {
    pDVar6 = (DAnimatedDoor *)
             M_Malloc_Dbg(0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    bVar10 = 1;
    DAnimatedDoor::DAnimatedDoor(pDVar6,(sector_t *)psVar1,line,speed,delay,pFVar5);
  }
LAB_003e9a5d:
  return (bool)(bVar10 & 1);
}

Assistant:

bool EV_SlidingDoor (line_t *line, AActor *actor, int tag, int speed, int delay)
{
	sector_t *sec;
	int secnum;
	bool rtn;

	secnum = -1;
	rtn = false;

	if (tag == 0)
	{
		// Manual sliding door
		sec = line->backsector;

		// Make sure door isn't already being animated
		if (sec->ceilingdata != NULL)
		{
			if (actor->player == NULL)
				return false;

			if (sec->ceilingdata->IsA (RUNTIME_CLASS(DAnimatedDoor)))
			{
				DAnimatedDoor *door = barrier_cast<DAnimatedDoor *>(sec->ceilingdata);
				if (door->m_Status == DAnimatedDoor::Waiting)
				{
					return door->StartClosing();
				}
			}
			return false;
		}
		FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
		if (anim != NULL)
		{
			new DAnimatedDoor (sec, line, speed, delay, anim);
			return true;
		}
		return false;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
		if (sec->ceilingdata != NULL)
		{
			continue;
		}

		for (int i = 0; tag != 0 && i < sec->linecount; ++i)
		{
			line = sec->lines[i];
			if (line->backsector == NULL)
			{
				continue;
			}
			FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
			if (anim != NULL)
			{
				rtn = true;
				new DAnimatedDoor (sec, line, speed, delay, anim);
				break;
			}
		}
	}
	return rtn;
}